

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::nonfinite_writer<wchar_t>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          nonfinite_writer<wchar_t> *f)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  wchar_t __tmp;
  sign_t sVar7;
  int *piVar8;
  char *pcVar9;
  size_t size;
  int *piVar10;
  ulong uVar11;
  byte bVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  buffer<wchar_t> *c;
  int iVar22;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  uVar16 = (ulong)(uint)specs->width;
  sVar7 = f->sign;
  uVar15 = 4 - (ulong)(sVar7 == none);
  puVar2 = *(undefined8 **)this;
  lVar13 = puVar2[2];
  uVar11 = uVar16 - uVar15;
  if (uVar16 < uVar15 || uVar11 == 0) {
    uVar15 = uVar15 + lVar13;
    if ((ulong)puVar2[3] < uVar15) {
      (**(code **)*puVar2)(puVar2,uVar15);
      sVar7 = f->sign;
    }
    puVar2[2] = uVar15;
    piVar10 = (int *)(lVar13 * 4 + puVar2[1]);
    if (sVar7 != none) {
      *piVar10 = (int)*(char *)((long)&basic_data<void>::signs + (ulong)sVar7);
      piVar10 = piVar10 + 1;
    }
    pcVar9 = f->str;
    uVar11 = 4;
    lVar13 = 0;
    do {
      piVar10[lVar13] = (int)pcVar9[lVar13];
      uVar11 = uVar11 - 1;
      lVar13 = lVar13 + 1;
    } while (1 < uVar11);
  }
  else {
    uVar14 = lVar13 + uVar16;
    if ((ulong)puVar2[3] < uVar14) {
      (**(code **)*puVar2)(puVar2,uVar14);
    }
    puVar2[2] = uVar14;
    auVar6 = _DAT_0019b820;
    auVar5 = _DAT_00198c20;
    auVar4 = _DAT_00196200;
    lVar3 = puVar2[1];
    piVar10 = (int *)(lVar3 + lVar13 * 4);
    wVar1 = (specs->fill).data_[0];
    bVar12 = specs->field_0x9 & 0xf;
    if (bVar12 == 3) {
      uVar14 = uVar11 >> 1;
      if (1 < uVar11) {
        piVar10 = piVar10 + uVar14;
        uVar11 = uVar14 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar27._8_4_ = (int)uVar11;
        auVar27._0_8_ = uVar11;
        auVar27._12_4_ = (int)(uVar11 >> 0x20);
        lVar3 = lVar3 + lVar13 * 4;
        lVar13 = 0;
        auVar27 = auVar27 ^ _DAT_00196200;
        do {
          auVar24._8_4_ = (int)lVar13;
          auVar24._0_8_ = lVar13;
          auVar24._12_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar28 = (auVar24 | auVar5) ^ auVar4;
          iVar22 = auVar27._4_4_;
          if ((bool)(~(auVar28._4_4_ == iVar22 && auVar27._0_4_ < auVar28._0_4_ ||
                      iVar22 < auVar28._4_4_) & 1)) {
            *(wchar_t *)(lVar3 + lVar13 * 4) = wVar1;
          }
          if ((auVar28._12_4_ != auVar27._12_4_ || auVar28._8_4_ <= auVar27._8_4_) &&
              auVar28._12_4_ <= auVar27._12_4_) {
            *(wchar_t *)(lVar3 + 4 + lVar13 * 4) = wVar1;
          }
          auVar24 = (auVar24 | auVar6) ^ auVar4;
          iVar29 = auVar24._4_4_;
          if (iVar29 <= iVar22 && (iVar29 != iVar22 || auVar24._0_4_ <= auVar27._0_4_)) {
            *(wchar_t *)(lVar3 + 8 + lVar13 * 4) = wVar1;
            *(wchar_t *)(lVar3 + 0xc + lVar13 * 4) = wVar1;
          }
          lVar13 = lVar13 + 4;
        } while ((uVar11 - ((uint)(uVar14 + 0x3fffffffffffffff) & 3)) + 4 != lVar13);
      }
      if ((ulong)f->sign != 0) {
        *piVar10 = (int)*(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
        piVar10 = piVar10 + 1;
      }
      pcVar9 = f->str;
      uVar11 = 4;
      do {
        piVar8 = piVar10;
        *piVar8 = (int)*pcVar9;
        auVar6 = _DAT_0019b820;
        auVar5 = _DAT_00198c20;
        auVar4 = _DAT_00196200;
        pcVar9 = pcVar9 + 1;
        uVar11 = uVar11 - 1;
        piVar10 = piVar8 + 1;
      } while (1 < uVar11);
      uVar15 = (uVar16 * 4 + (uVar15 + uVar14) * -4) - 4;
      auVar28._8_4_ = (int)uVar15;
      auVar28._0_8_ = uVar15;
      auVar28._12_4_ = (int)(uVar15 >> 0x20);
      auVar19._0_8_ = uVar15 >> 2;
      auVar19._8_8_ = auVar28._8_8_ >> 2;
      uVar11 = 0;
      auVar19 = auVar19 ^ _DAT_00196200;
      do {
        auVar25._8_4_ = (int)uVar11;
        auVar25._0_8_ = uVar11;
        auVar25._12_4_ = (int)(uVar11 >> 0x20);
        auVar27 = (auVar25 | auVar5) ^ auVar4;
        iVar22 = auVar19._4_4_;
        if ((bool)(~(auVar27._4_4_ == iVar22 && auVar19._0_4_ < auVar27._0_4_ ||
                    iVar22 < auVar27._4_4_) & 1)) {
          (piVar8 + 1)[uVar11] = wVar1;
        }
        if ((auVar27._12_4_ != auVar19._12_4_ || auVar27._8_4_ <= auVar19._8_4_) &&
            auVar27._12_4_ <= auVar19._12_4_) {
          piVar8[uVar11 + 2] = wVar1;
        }
        auVar27 = (auVar25 | auVar6) ^ auVar4;
        iVar29 = auVar27._4_4_;
        if (iVar29 <= iVar22 && (iVar29 != iVar22 || auVar27._0_4_ <= auVar19._0_4_)) {
          piVar8[uVar11 + 3] = wVar1;
          piVar8[uVar11 + 4] = wVar1;
        }
        uVar11 = uVar11 + 4;
      } while (((uVar15 >> 2) + 4 & 0xfffffffffffffffc) != uVar11);
    }
    else if (bVar12 == 2) {
      piVar10 = piVar10 + uVar11;
      uVar15 = (uVar16 * 4 + uVar15 * -4) - 4;
      auVar17._8_4_ = (int)uVar15;
      auVar17._0_8_ = uVar15;
      auVar17._12_4_ = (int)(uVar15 >> 0x20);
      auVar18._0_8_ = uVar15 >> 2;
      auVar18._8_8_ = auVar17._8_8_ >> 2;
      lVar3 = lVar3 + lVar13 * 4;
      uVar11 = 0;
      auVar18 = auVar18 ^ _DAT_00196200;
      do {
        auVar23._8_4_ = (int)uVar11;
        auVar23._0_8_ = uVar11;
        auVar23._12_4_ = (int)(uVar11 >> 0x20);
        auVar27 = (auVar23 | auVar5) ^ auVar4;
        iVar22 = auVar18._4_4_;
        if ((bool)(~(auVar27._4_4_ == iVar22 && auVar18._0_4_ < auVar27._0_4_ ||
                    iVar22 < auVar27._4_4_) & 1)) {
          *(wchar_t *)(lVar3 + uVar11 * 4) = wVar1;
        }
        if ((auVar27._12_4_ != auVar18._12_4_ || auVar27._8_4_ <= auVar18._8_4_) &&
            auVar27._12_4_ <= auVar18._12_4_) {
          *(wchar_t *)(lVar3 + 4 + uVar11 * 4) = wVar1;
        }
        auVar27 = (auVar23 | auVar6) ^ auVar4;
        iVar29 = auVar27._4_4_;
        if (iVar29 <= iVar22 && (iVar29 != iVar22 || auVar27._0_4_ <= auVar18._0_4_)) {
          *(wchar_t *)(lVar3 + 8 + uVar11 * 4) = wVar1;
          *(wchar_t *)(lVar3 + 0xc + uVar11 * 4) = wVar1;
        }
        uVar11 = uVar11 + 4;
      } while (((uVar15 >> 2) + 4 & 0xfffffffffffffffc) != uVar11);
      if ((ulong)f->sign != 0) {
        *piVar10 = (int)*(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
        piVar10 = piVar10 + 1;
      }
      pcVar9 = f->str;
      uVar11 = 4;
      lVar13 = 0;
      do {
        piVar10[lVar13] = (int)pcVar9[lVar13];
        uVar11 = uVar11 - 1;
        lVar13 = lVar13 + 1;
      } while (1 < uVar11);
    }
    else {
      if ((ulong)f->sign != 0) {
        *piVar10 = (int)*(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
        piVar10 = piVar10 + 1;
      }
      pcVar9 = f->str;
      uVar11 = 4;
      do {
        piVar8 = piVar10;
        *piVar8 = (int)*pcVar9;
        auVar6 = _DAT_0019b820;
        auVar5 = _DAT_00198c20;
        auVar4 = _DAT_00196200;
        pcVar9 = pcVar9 + 1;
        uVar11 = uVar11 - 1;
        piVar10 = piVar8 + 1;
      } while (1 < uVar11);
      uVar15 = (uVar16 * 4 + uVar15 * -4) - 4;
      auVar20._8_4_ = (int)uVar15;
      auVar20._0_8_ = uVar15;
      auVar20._12_4_ = (int)(uVar15 >> 0x20);
      auVar21._0_8_ = uVar15 >> 2;
      auVar21._8_8_ = auVar20._8_8_ >> 2;
      uVar11 = 0;
      auVar21 = auVar21 ^ _DAT_00196200;
      do {
        auVar26._8_4_ = (int)uVar11;
        auVar26._0_8_ = uVar11;
        auVar26._12_4_ = (int)(uVar11 >> 0x20);
        auVar27 = (auVar26 | auVar5) ^ auVar4;
        iVar22 = auVar21._4_4_;
        if ((bool)(~(auVar27._4_4_ == iVar22 && auVar21._0_4_ < auVar27._0_4_ ||
                    iVar22 < auVar27._4_4_) & 1)) {
          (piVar8 + 1)[uVar11] = wVar1;
        }
        if ((auVar27._12_4_ != auVar21._12_4_ || auVar27._8_4_ <= auVar21._8_4_) &&
            auVar27._12_4_ <= auVar21._12_4_) {
          piVar8[uVar11 + 2] = wVar1;
        }
        auVar27 = (auVar26 | auVar6) ^ auVar4;
        iVar29 = auVar27._4_4_;
        if (iVar29 <= iVar22 && (iVar29 != iVar22 || auVar27._0_4_ <= auVar21._0_4_)) {
          piVar8[uVar11 + 3] = wVar1;
          piVar8[uVar11 + 4] = wVar1;
        }
        uVar11 = uVar11 + 4;
      } while (((uVar15 >> 2) + 4 & 0xfffffffffffffffc) != uVar11);
    }
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }